

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_count.cpp
# Opt level: O0

void __thiscall BamTools::CountTool::CountTool(CountTool *this)

{
  _func_int **pp_Var1;
  OptionGroup *pOVar2;
  AbstractTool *in_RDI;
  OptionGroup *IO_Opts;
  string *in_stack_fffffffffffffc88;
  CountSettings *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffce0;
  allocator local_299;
  string local_298 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  bool *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  OptionGroup *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  OptionGroup *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  OptionGroup *local_98;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [56];
  
  AbstractTool::AbstractTool(in_RDI);
  in_RDI->_vptr_AbstractTool = (_func_int **)&PTR__CountTool_0033ed58;
  pp_Var1 = (_func_int **)operator_new(0x60);
  CountSettings::CountSettings(in_stack_fffffffffffffc90);
  in_RDI[1]._vptr_AbstractTool = pp_Var1;
  in_RDI[2]._vptr_AbstractTool = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"bamtools count",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"prints number of alignments in BAM file(s)",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,"[-in <filename> -in <filename> ... | -list <filelist>] [-region <REGION>]",
             &local_89);
  Options::SetProgramInfo
            ((string *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(string *)0x1fd4de);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Input & Output",&local_b9);
  pOVar2 = Options::CreateOptionGroup(in_stack_fffffffffffffce0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_98 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"-in",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"BAM filename",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"the input BAM file(s)",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"",&local_159);
  Options::StandardIn_abi_cxx11_();
  Options::
  AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,&in_stack_fffffffffffffdb0->Name,
             in_stack_fffffffffffffda8,(bool *)in_stack_fffffffffffffda0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffd98,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"-list",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"filename",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"the input BAM file list, one line per file",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"",&local_1f9);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
             in_stack_fffffffffffffdb0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"-region",(allocator *)&stack0xfffffffffffffddf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffdb8,"REGION",(allocator *)&stack0xfffffffffffffdb7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffd90,
             "genomic region. Index file is recommended for better performance, and is used automatically if it exists. See \'bamtools help index\' for more details on creating one"
             ,(allocator *)&stack0xfffffffffffffd8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"",&local_299);
  Options::AddValueOption<std::__cxx11::string>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
             in_stack_fffffffffffffdb0);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd8f);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdb7);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffddf);
  return;
}

Assistant:

CountTool::CountTool()
    : AbstractTool()
    , m_settings(new CountSettings)
    , m_impl(0)
{
    // set program details
    Options::SetProgramInfo(
        "bamtools count", "prints number of alignments in BAM file(s)",
        "[-in <filename> -in <filename> ... | -list <filelist>] [-region <REGION>]");

    // set up options
    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");
    Options::AddValueOption("-in", "BAM filename", "the input BAM file(s)", "",
                            m_settings->HasInput, m_settings->InputFiles, IO_Opts,
                            Options::StandardIn());
    Options::AddValueOption("-list", "filename", "the input BAM file list, one line per file", "",
                            m_settings->HasInputFilelist, m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-region", "REGION",
                            "genomic region. Index file is recommended for better performance, and "
                            "is used automatically if it exists. See \'bamtools help index\' for "
                            "more details on creating one",
                            "", m_settings->HasRegion, m_settings->Region, IO_Opts);
}